

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManPrintMatches(Nf_Man_t *p)

{
  uint uVar1;
  Nf_Obj_t *pNVar2;
  ulong uVar3;
  Gia_Man_t *pGVar4;
  long lVar5;
  ulong uVar6;
  
  pGVar4 = p->pGia;
  if (0 < pGVar4->nObjs) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(uint *)(&pGVar4->pObjs->field_0x0 + lVar5);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        pNVar2 = p->pNfObjs;
        printf("%5d : ",uVar6 & 0xffffffff);
        uVar3 = (&pNVar2->M[0][0].D)[lVar5];
        printf("Dp = %6.2f  ",
               (double)(float)((double)((uint)uVar3 & 0x3fffffff) * 0.001 +
                              (double)(uVar3 >> 0x1e & 0xffffffff) * 1073741.824));
        uVar3 = (&pNVar2->M[1][0].D)[lVar5];
        printf("Dn = %6.2f  ",
               (double)(float)((double)((uint)uVar3 & 0x3fffffff) * 0.001 +
                              (double)(uVar3 >> 0x1e & 0xffffffff) * 1073741.824));
        printf("  ");
        uVar3 = (&pNVar2->M[0][1].D)[lVar5];
        printf("Ap = %6.2f  ",
               (double)(float)((double)((uint)uVar3 & 0x3fffffff) * 0.001 +
                              (double)(uVar3 >> 0x1e & 0xffffffff) * 1073741.824));
        uVar3 = (&pNVar2->M[1][1].D)[lVar5];
        printf("An = %6.2f  ",
               (double)(float)((double)((uint)uVar3 & 0x3fffffff) * 0.001 +
                              (double)(uVar3 >> 0x1e & 0xffffffff) * 1073741.824));
        printf("  ");
        printf("Dp = %8s ",
               p->pCells[(ulong)*(uint *)(&pNVar2->M[0][0].field_0x0 + lVar5 * 8) & 0xfffff].pName);
        printf("Dn = %8s ",
               p->pCells[(ulong)*(uint *)(&pNVar2->M[1][0].field_0x0 + lVar5 * 8) & 0xfffff].pName);
        printf("Ap = %8s ",
               p->pCells[(ulong)*(uint *)(&pNVar2->M[0][1].field_0x0 + lVar5 * 8) & 0xfffff].pName);
        printf("An = %8s ",
               p->pCells[(ulong)*(uint *)(&pNVar2->M[1][1].field_0x0 + lVar5 * 8) & 0xfffff].pName);
        putchar(10);
        pGVar4 = p->pGia;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while ((long)uVar6 < (long)pGVar4->nObjs);
  }
  return;
}

Assistant:

void Nf_ManPrintMatches( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        Nf_Mat_t * pDp = Nf_ObjMatchD( p, i, 0 );
        Nf_Mat_t * pAp = Nf_ObjMatchA( p, i, 0 );
        Nf_Mat_t * pDn = Nf_ObjMatchD( p, i, 1 );
        Nf_Mat_t * pAn = Nf_ObjMatchA( p, i, 1 );

        printf( "%5d : ", i );
        printf( "Dp = %6.2f  ", Nf_Wrd2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Nf_Wrd2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Nf_Wrd2Flt(pAp->D) );
        printf( "An = %6.2f  ", Nf_Wrd2Flt(pAn->D) );
        printf( "  " );
        printf( "Dp = %8s ", Nf_ManCell(p, pDp->Gate)->pName );
        printf( "Dn = %8s ", Nf_ManCell(p, pDn->Gate)->pName );
        printf( "Ap = %8s ", Nf_ManCell(p, pAp->Gate)->pName );
        printf( "An = %8s ", Nf_ManCell(p, pAn->Gate)->pName );
        printf( "\n" );

    }
}